

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O1

set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *
wasm::anon_unknown_11::parseNameList
          (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
           *__return_storage_ptr__,string *listOrFile)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  istream *piVar3;
  ostream *poVar4;
  string_view sVar5;
  long local_288;
  ifstream infile;
  ios_base local_210 [400];
  string_view local_80;
  string_view local_70;
  long local_60 [2];
  size_type *local_50;
  string line;
  
  if ((listOrFile->_M_string_length == 0) || (*(listOrFile->_M_dataplus)._M_p != '@')) {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_288,(string *)listOrFile,_S_in);
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    local_50 = &line._M_string_length;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_288,(string *)&local_50,',');
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      sVar5 = (string_view)wasm::IString::interned(line._M_dataplus._M_p,local_50,0);
      local_70 = sVar5;
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_M_insert_unique<wasm::Name>(&__return_storage_ptr__->_M_t,(Name *)&local_70);
    }
    if (local_50 != &line._M_string_length) {
      operator_delete(local_50,CONCAT71(line._M_string_length._1_7_,
                                        (undefined1)line._M_string_length) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_288);
    std::ios_base::~ios_base(local_210);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)listOrFile);
    std::ifstream::ifstream((istream *)&local_288,(string *)&local_70,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed opening \'",0x10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_70._M_len,(long)local_70._M_str);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(1);
    }
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    local_50 = &line._M_string_length;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_288 + -0x18) + (char)(istream *)&local_288
                             );
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_288,(string *)&local_50,cVar2);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      if (line._M_dataplus._M_p != (pointer)0x0) {
        sVar5 = (string_view)wasm::IString::interned(line._M_dataplus._M_p,local_50,0);
        local_80 = sVar5;
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::_M_insert_unique<wasm::Name>(&__return_storage_ptr__->_M_t,(Name *)&local_80);
      }
    }
    if (local_50 != &line._M_string_length) {
      operator_delete(local_50,CONCAT71(line._M_string_length._1_7_,
                                        (undefined1)line._M_string_length) + 1);
    }
    std::ifstream::~ifstream(&local_288);
    if ((long *)local_70._M_len != local_60) {
      operator_delete((void *)local_70._M_len,local_60[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<Name> parseNameList(const std::string& listOrFile) {
  if (!listOrFile.empty() && listOrFile[0] == '@') {
    return parseNameListFromFile(listOrFile.substr(1));
  }

  return parseNameListFromLine(listOrFile);
}